

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O2

void __thiscall Block::ReadFile(Block *this)

{
  ostream *poVar1;
  ifstream in;
  byte abStack_1f8 [488];
  
  std::ifstream::ifstream(&in);
  std::ifstream::open((string *)&in,(_Ios_Openmode)this);
  if ((abStack_1f8[*(long *)(_in + -0x18)] & 1) == 0) {
    std::istream::seekg(&in,(long)this->FileOff << 0xd,0);
    std::istream::read((char *)&in,(long)this->data);
    std::ifstream::close();
    std::ifstream::~ifstream(&in);
    return;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)this);
  poVar1 = std::operator<<(poVar1,": No such a file!");
  std::endl<char,std::char_traits<char>>(poVar1);
  system("pause");
  exit(1);
}

Assistant:

void Block::ReadFile(void) {
	ifstream in;
	in.open(this->FileName, ios::in | ios::binary);
	if (in.bad()) {
		cout << this->FileName << ": No such a file!" << endl;
		system("pause");
		exit(1);
	}
	in.seekg(this->FileOff * BLOCK_SIZE);
	//cout << in.tellg() << endl;
	in.read(reinterpret_cast<char*> (this->data), BLOCK_SIZE);
	in.close();
}